

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::PlotEx(ImGuiPlotType plot_type,char *label,_func_float_void_ptr_int *values_getter,
                  void *data,int values_count,int values_offset,char *overlay_text,float scale_min,
                  float scale_max,ImVec2 graph_size)

{
  ImU32 IVar1;
  undefined8 uVar2;
  bool bVar3;
  ImU32 IVar4;
  uint uVar5;
  int iVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  uint in_XMM0_Db;
  ImVec2 IVar11;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  undefined1 extraout_var [12];
  float fVar12;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar13;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  float fVar14;
  ImVec2 pos0;
  ImRect inner_bb;
  ImRect frame_bb;
  ImRect total_bb;
  ImVec2 local_120;
  ImVec2 local_118;
  undefined8 uStack_110;
  ImVec2 local_108;
  undefined8 uStack_100;
  ImGuiContext *local_f0;
  ImU32 local_e4;
  ImVec2 local_e0;
  undefined1 local_d8 [8];
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined1 local_c8 [8];
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  float local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  ulong local_a8;
  ImGuiWindow *local_a0;
  float local_94;
  ImRect local_90;
  ImRect local_80;
  char *local_70;
  ImVec2 local_68;
  float local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  ImRect local_40;
  ulong uVar6;
  
  local_f0 = GImGui;
  local_a0 = GImGui->CurrentWindow;
  local_a0->WriteAccessed = true;
  if (local_a0->SkipItems == false) {
    local_c8._4_4_ = in_XMM1_Db;
    local_c8._0_4_ = scale_max;
    uStack_c0 = in_XMM1_Dc;
    uStack_bc = in_XMM1_Dd;
    uStack_d0 = in_XMM2_Dc;
    local_d8 = (undefined1  [8])graph_size;
    uStack_cc = in_XMM2_Dd;
    local_b8 = scale_min;
    uStack_b4 = in_XMM0_Db;
    uStack_b0 = in_XMM0_Dc;
    uStack_ac = in_XMM0_Dd;
    local_68 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_80.Max.x = (float)local_d8._0_4_;
    if (((float)local_d8._0_4_ == 0.0) && (!NAN((float)local_d8._0_4_))) {
      local_80.Max.x = CalcItemWidth();
    }
    if (((float)local_d8._4_4_ == 0.0) && (!NAN((float)local_d8._4_4_))) {
      fVar12 = (local_f0->Style).FramePadding.y;
      local_d8._4_4_ = fVar12 + fVar12 + local_68.y;
    }
    local_80.Min.x = (local_a0->DC).CursorPos.x;
    local_80.Min.y = (local_a0->DC).CursorPos.y;
    local_40.Min = (local_a0->DC).CursorPos;
    local_d8._0_4_ = local_80.Max.x;
    local_80.Max.x = local_80.Max.x + local_80.Min.x;
    local_80.Max.y = (float)local_d8._4_4_ + local_80.Min.y;
    IVar11 = (local_f0->Style).FramePadding;
    fVar12 = IVar11.x;
    fVar10 = IVar11.y;
    local_90.Min.x = local_80.Min.x + fVar12;
    local_90.Min.y = local_80.Min.y + fVar10;
    local_90.Max.x = local_80.Max.x - fVar12;
    local_90.Max.y = local_80.Max.y - fVar10;
    fVar12 = 0.0;
    if (0.0 < local_68.x) {
      fVar12 = (local_f0->Style).ItemInnerSpacing.x + local_68.x;
    }
    local_40.Max.x = local_80.Max.x + fVar12;
    local_40.Max.y = local_80.Max.y + 0.0;
    ItemSize(&local_40,(local_f0->Style).FramePadding.y);
    bVar3 = ItemAdd(&local_40,0,&local_80);
    if (bVar3) {
      bVar3 = ItemHoverable(&local_90,0);
      local_70 = label;
      if (((local_b8 == 3.4028235e+38) && (!NAN(local_b8))) ||
         (((float)local_c8._0_4_ == 3.4028235e+38 && (!NAN((float)local_c8._0_4_))))) {
        if (values_count < 1) {
          local_118.x = -3.4028235e+38;
          local_108.y = 0.0;
          local_108.x = 3.4028235e+38;
          uStack_100._0_4_ = 0;
          uStack_100._4_4_ = 0;
        }
        else {
          iVar7 = 0;
          local_118.x = -3.4028235e+38;
          local_118.y = 0.0;
          uStack_110._0_4_ = 0;
          uStack_110._4_4_ = 0;
          local_108.x = 3.4028235e+38;
          local_108.y = 0.0;
          uStack_100._0_4_ = 0;
          uStack_100._4_4_ = 0;
          do {
            fVar12 = (*values_getter)(data,iVar7);
            if (fVar12 <= local_108.x) {
              local_108.x = fVar12;
            }
            local_118.y = (float)(extraout_var._0_4_ & (uint)local_118.y);
            uStack_110._0_4_ = extraout_var._4_4_ & (uint)uStack_110;
            uStack_110._4_4_ = extraout_var._8_4_ & uStack_110._4_4_;
            local_118.x = (float)(-(uint)(fVar12 <= local_118.x) & (uint)local_118.x |
                                 ~-(uint)(fVar12 <= local_118.x) & (uint)fVar12);
            iVar7 = iVar7 + 1;
          } while (values_count != iVar7);
        }
        uStack_b4 = (uint)local_108.y & uStack_b4;
        uStack_b0 = (uint)uStack_100 & uStack_b0;
        uStack_ac = uStack_100._4_4_ & uStack_ac;
        local_b8 = (float)(~-(uint)(local_b8 == 3.4028235e+38) & (uint)local_b8 |
                          (uint)local_108.x & -(uint)(local_b8 == 3.4028235e+38));
        local_c8._0_4_ =
             ~-(uint)((float)local_c8._0_4_ == 3.4028235e+38) & local_c8._0_4_ |
             (uint)local_118.x & -(uint)((float)local_c8._0_4_ == 3.4028235e+38);
      }
      local_108.y = local_80.Min.y;
      local_108.x = local_80.Min.x;
      uStack_100 = 0;
      local_118.y = local_80.Max.y;
      local_118.x = local_80.Max.x;
      uStack_110 = 0;
      IVar4 = GetColorU32(7,1.0);
      RenderFrame(local_108,local_118,IVar4,true,(local_f0->Style).FrameRounding);
      if (0 < values_count) {
        iVar7 = (int)(float)local_d8._0_4_;
        if (values_count <= (int)(float)local_d8._0_4_) {
          iVar7 = values_count;
        }
        fVar12 = (float)(values_count - (uint)(plot_type == ImGuiPlotType_Lines));
        local_108.x = fVar12;
        local_a8 = 0xffffffff;
        if (bVar3) {
          fVar9 = ((local_f0->IO).MousePos.x - local_90.Min.x) / (local_90.Max.x - local_90.Min.x);
          fVar10 = 0.9999;
          if (fVar9 <= 0.9999) {
            fVar10 = fVar9;
          }
          uVar5 = (uint)((float)(int)fVar12 * (float)(~-(uint)(fVar9 < 0.0) & (uint)fVar10));
          uVar6 = (ulong)uVar5;
          fVar12 = (*values_getter)(data,(int)(values_offset + uVar5) % values_count);
          local_118.x = fVar12;
          (*values_getter)(data,(int)(values_offset + uVar5 + 1) % values_count);
          local_a8 = uVar6;
          if (plot_type == ImGuiPlotType_Lines) {
            SetTooltip("%d: %8.4g\n%d: %8.4g",(ulong)uVar5,(ulong)(uVar5 + 1));
          }
          else if (plot_type == ImGuiPlotType_Histogram) {
            SetTooltip("%d: %8.4g",(double)local_118.x,(ulong)uVar5);
          }
        }
        iVar7 = iVar7 - (uint)(plot_type == ImGuiPlotType_Lines);
        _local_d8 = ZEXT416(~-(uint)(local_b8 == (float)local_c8._0_4_) &
                            (uint)(1.0 / ((float)local_c8._0_4_ - local_b8)));
        fVar12 = (*values_getter)(data,values_offset % values_count);
        local_118.x = fVar12;
        if (0.0 <= (float)local_c8._0_4_ * local_b8) {
          uStack_54 = 0;
          local_58 = (float)(~-(uint)(local_b8 < 0.0) & 0x3f800000);
          uStack_50 = 0;
          uStack_4c = 0;
        }
        else {
          uStack_54 = uStack_b4 ^ 0x80000000;
          uStack_50 = uStack_b0 ^ 0x80000000;
          uStack_4c = uStack_ac ^ 0x80000000;
          local_58 = -local_b8 * (float)local_d8._0_4_;
        }
        local_e4 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x26,1.0);
        IVar4 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x27,1.0);
        if (0 < iVar7) {
          fVar10 = (float)local_d8._0_4_ * (local_118.x - local_b8);
          fVar12 = 1.0;
          if (fVar10 <= 1.0) {
            fVar12 = fVar10;
          }
          fVar9 = (float)(-(uint)(fVar10 < 0.0) & 0x3f800000 |
                         ~-(uint)(fVar10 < 0.0) & (uint)(1.0 - fVar12));
          _local_c8 = ZEXT416((uint)(1.0 / (float)iVar7));
          local_94 = (float)(int)local_108.x;
          fVar12 = 0.0;
          fVar10 = 0.0;
          fVar13 = 0.0;
          do {
            local_108.y = fVar9;
            local_108.x = fVar12;
            uStack_100 = CONCAT44(fVar13,fVar10);
            iVar8 = (int)(fVar12 * local_94 + 0.5);
            fVar10 = (*values_getter)(data,(values_offset + 1 + iVar8) % values_count);
            uVar2 = uStack_100;
            fVar12 = (float)local_c8._0_4_ + local_108.x;
            fVar9 = (fVar10 - local_b8) * (float)local_d8._0_4_;
            fVar10 = 1.0;
            if (fVar9 <= 1.0) {
              fVar10 = fVar9;
            }
            IVar11 = (ImVec2)((ulong)-(uint)(fVar9 < 0.0) & 0xffffffff3f800000 |
                             (ulong)(~-(uint)(fVar9 < 0.0) & (uint)(1.0 - fVar10)));
            fVar9 = local_90.Min.x;
            fVar10 = local_90.Max.x - fVar9;
            local_120.y = local_90.Min.y;
            fVar14 = local_90.Max.y - local_120.y;
            fVar13 = local_108.x * fVar10 + fVar9;
            local_e0.y = local_108.y * fVar14 + local_120.y;
            local_e0.x = fVar13;
            fVar9 = fVar10 * fVar12 + fVar9;
            uStack_100 = local_c8._8_8_;
            if (plot_type == ImGuiPlotType_Lines) {
              local_120.y = fVar14 * IVar11.x + local_120.y;
              local_120.x = fVar9;
              IVar1 = local_e4;
              if ((int)local_a8 == iVar8) {
                IVar1 = IVar4;
              }
              local_108.y = (float)local_c8._4_4_;
              local_108.x = fVar12;
              uStack_110 = 0;
              local_118 = IVar11;
              ImDrawList::AddLine(local_a0->DrawList,&local_e0,&local_120,IVar1,1.0);
              IVar11 = local_118;
              fVar12 = local_108.x;
              fVar10 = local_108.y;
              uVar2 = uStack_100;
            }
            else {
              local_120.y = fVar14 * local_58 + local_120.y;
              local_120.x = fVar9;
              fVar10 = (float)local_c8._4_4_;
              if (plot_type == ImGuiPlotType_Histogram) {
                uStack_110 = 0;
                local_108.y = (float)local_c8._4_4_;
                local_108.x = fVar12;
                if (fVar13 + 2.0 <= fVar9) {
                  local_120.x = fVar9 + -1.0;
                }
                IVar1 = local_e4;
                if ((int)local_a8 == iVar8) {
                  IVar1 = IVar4;
                }
                local_118 = IVar11;
                ImDrawList::AddRectFilled(local_a0->DrawList,&local_e0,&local_120,IVar1,0.0,0xf);
                IVar11 = local_118;
                fVar12 = local_108.x;
                fVar10 = local_108.y;
                uVar2 = uStack_100;
              }
            }
            uStack_100 = uVar2;
            fVar13 = IVar11.y;
            fVar9 = IVar11.x;
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
      }
      if (overlay_text != (char *)0x0) {
        local_e0.y = local_80.Min.y + (local_f0->Style).FramePadding.y;
        local_e0.x = local_80.Min.x;
        local_120.x = 0.5;
        local_120.y = 0.0;
        RenderTextClipped(&local_e0,&local_80.Max,overlay_text,(char *)0x0,(ImVec2 *)0x0,&local_120,
                          (ImRect *)0x0);
      }
      if (0.0 < local_68.x) {
        IVar11.x = local_80.Max.x + (local_f0->Style).ItemInnerSpacing.x;
        IVar11.y = local_90.Min.y;
        RenderText(IVar11,local_70,(char *)0x0,true);
      }
    }
  }
  return;
}

Assistant:

void ImGui::PlotEx(ImGuiPlotType plot_type, const char* label, float (*values_getter)(void* data, int idx), void* data, int values_count, int values_offset, const char* overlay_text, float scale_min, float scale_max, ImVec2 graph_size)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (graph_size.x == 0.0f)
        graph_size.x = CalcItemWidth();
    if (graph_size.y == 0.0f)
        graph_size.y = label_size.y + (style.FramePadding.y * 2);

    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(graph_size.x, graph_size.y));
    const ImRect inner_bb(frame_bb.Min + style.FramePadding, frame_bb.Max - style.FramePadding);
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0, &frame_bb))
        return;
    const bool hovered = ItemHoverable(inner_bb, 0);

    // Determine scale from values if not specified
    if (scale_min == FLT_MAX || scale_max == FLT_MAX)
    {
        float v_min = FLT_MAX;
        float v_max = -FLT_MAX;
        for (int i = 0; i < values_count; i++)
        {
            const float v = values_getter(data, i);
            v_min = ImMin(v_min, v);
            v_max = ImMax(v_max, v);
        }
        if (scale_min == FLT_MAX)
            scale_min = v_min;
        if (scale_max == FLT_MAX)
            scale_max = v_max;
    }

    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    if (values_count > 0)
    {
        int res_w = ImMin((int)graph_size.x, values_count) + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);
        int item_count = values_count + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);

        // Tooltip on hover
        int v_hovered = -1;
        if (hovered)
        {
            const float t = ImClamp((g.IO.MousePos.x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x), 0.0f, 0.9999f);
            const int v_idx = (int)(t * item_count);
            IM_ASSERT(v_idx >= 0 && v_idx < values_count);

            const float v0 = values_getter(data, (v_idx + values_offset) % values_count);
            const float v1 = values_getter(data, (v_idx + 1 + values_offset) % values_count);
            if (plot_type == ImGuiPlotType_Lines)
                SetTooltip("%d: %8.4g\n%d: %8.4g", v_idx, v0, v_idx+1, v1);
            else if (plot_type == ImGuiPlotType_Histogram)
                SetTooltip("%d: %8.4g", v_idx, v0);
            v_hovered = v_idx;
        }

        const float t_step = 1.0f / (float)res_w;
        const float inv_scale = (scale_min == scale_max) ? 0.0f : (1.0f / (scale_max - scale_min));

        float v0 = values_getter(data, (0 + values_offset) % values_count);
        float t0 = 0.0f;
        ImVec2 tp0 = ImVec2( t0, 1.0f - ImSaturate((v0 - scale_min) * inv_scale) );                       // Point in the normalized space of our target rectangle
        float histogram_zero_line_t = (scale_min * scale_max < 0.0f) ? (-scale_min * inv_scale) : (scale_min < 0.0f ? 0.0f : 1.0f);   // Where does the zero line stands

        const ImU32 col_base = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLines : ImGuiCol_PlotHistogram);
        const ImU32 col_hovered = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLinesHovered : ImGuiCol_PlotHistogramHovered);

        for (int n = 0; n < res_w; n++)
        {
            const float t1 = t0 + t_step;
            const int v1_idx = (int)(t0 * item_count + 0.5f);
            IM_ASSERT(v1_idx >= 0 && v1_idx < values_count);
            const float v1 = values_getter(data, (v1_idx + values_offset + 1) % values_count);
            const ImVec2 tp1 = ImVec2( t1, 1.0f - ImSaturate((v1 - scale_min) * inv_scale) );

            // NB: Draw calls are merged together by the DrawList system. Still, we should render our batch are lower level to save a bit of CPU.
            ImVec2 pos0 = ImLerp(inner_bb.Min, inner_bb.Max, tp0);
            ImVec2 pos1 = ImLerp(inner_bb.Min, inner_bb.Max, (plot_type == ImGuiPlotType_Lines) ? tp1 : ImVec2(tp1.x, histogram_zero_line_t));
            if (plot_type == ImGuiPlotType_Lines)
            {
                window->DrawList->AddLine(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
            }
            else if (plot_type == ImGuiPlotType_Histogram)
            {
                if (pos1.x >= pos0.x + 2.0f)
                    pos1.x -= 1.0f;
                window->DrawList->AddRectFilled(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
            }

            t0 = t1;
            tp0 = tp1;
        }
    }

    // Text overlay
    if (overlay_text)
        RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, overlay_text, NULL, NULL, ImVec2(0.5f,0.0f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, inner_bb.Min.y), label);
}